

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
* __thiscall
libtorrent::aux::session_impl::add_port_mapping
          (vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
           *__return_storage_ptr__,session_impl *this,portmap_protocol t,int external_port,
          int param_3)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  element_type *this_01;
  basic_endpoint<boost::asio::ip::tcp> local_d4;
  value_type local_b8 [4];
  basic_endpoint<boost::asio::ip::tcp> local_a8;
  value_type local_8c;
  address local_88;
  undefined1 local_64 [8];
  endpoint ep;
  shared_ptr<libtorrent::aux::listen_socket_t> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *__range2;
  int local_port_local;
  int external_port_local;
  portmap_protocol t_local;
  session_impl *this_local;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
  *ret;
  
  ::std::
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
  ::vector(__return_storage_ptr__);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ::begin(&this->m_listen_sockets);
  s = (shared_ptr<libtorrent::aux::listen_socket_t> *)
      ::std::
      vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ::end(&this->m_listen_sockets);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                     *)&s), bVar1) {
    ep.impl_.data_._20_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
         ::operator*(&__end2);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ep.impl_.data_._20_8_);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              (&local_88,&peVar2->local_endpoint);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              ((basic_endpoint<boost::asio::ip::tcp> *)local_64,&local_88,(unsigned_short)param_3);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ep.impl_.data_._20_8_);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->upnp_mapper);
    if (bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ep.impl_.data_._20_8_);
      this_00 = ::std::
                __shared_ptr_access<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar2->upnp_mapper);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                (&local_a8,(basic_endpoint<boost::asio::ip::tcp> *)local_64);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ep.impl_.data_._20_8_);
      local_8c.m_val = (int)upnp::add_mapping(this_00,t,external_port,&local_a8,&peVar2->device);
      ::std::
      vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
      ::push_back(__return_storage_ptr__,&local_8c);
    }
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ep.impl_.data_._20_8_);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->natpmp_mapper);
    if (bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ep.impl_.data_._20_8_);
      this_01 = ::std::
                __shared_ptr_access<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar2->natpmp_mapper);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                (&local_d4,(basic_endpoint<boost::asio::ip::tcp> *)local_64);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)ep.impl_.data_._20_8_);
      local_b8[0].m_val =
           (int)natpmp::add_mapping(this_01,t,external_port,&local_d4,&peVar2->device);
      ::std::
      vector<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>_>_>
      ::push_back(__return_storage_ptr__,local_b8);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<port_mapping_t> session_impl::add_port_mapping(portmap_protocol const t
		, int const external_port
		, int const local_port)
	{
		std::vector<port_mapping_t> ret;
		for (auto& s : m_listen_sockets)
		{
			tcp::endpoint const ep{s->local_endpoint.address(), static_cast<std::uint16_t>(local_port)};
			if (s->upnp_mapper) ret.push_back(s->upnp_mapper->add_mapping(
				t, external_port, ep, s->device));
			if (s->natpmp_mapper) ret.push_back(s->natpmp_mapper->add_mapping(
				t, external_port, ep, s->device));
		}
		return ret;
	}